

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_13::NameApplier::OnMemoryInitExpr(NameApplier *this,MemoryInitExpr *expr)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = UseNameForDataSegmentVar(this,&expr->var);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    RVar1 = UseNameForMemoryVar(this,&(expr->super_MemoryExpr<(wabt::ExprType)32>).memidx);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result NameApplier::OnMemoryInitExpr(MemoryInitExpr* expr) {
  CHECK_RESULT(UseNameForDataSegmentVar(&expr->var));
  CHECK_RESULT(UseNameForMemoryVar(&expr->memidx));
  return Result::Ok;
}